

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdflogger-c.cc
# Opt level: O0

void qpdflogger_set_save(qpdflogger_handle l,qpdf_log_dest_e dest,qpdf_log_fn_t fn,void *udata,
                        int only_if_not_set)

{
  element_type *l_00;
  function<void_(std::shared_ptr<Pipeline>)> local_98;
  element_type *local_78;
  code *local_70;
  undefined8 local_68;
  _Mem_fn<void_(QPDFLogger::*)(std::shared_ptr<Pipeline>,_bool)> local_60;
  undefined1 local_50 [8];
  type method;
  int only_if_not_set_local;
  void *udata_local;
  qpdf_log_fn_t fn_local;
  qpdf_log_dest_e dest_local;
  qpdflogger_handle l_local;
  
  local_70 = QPDFLogger::setSave;
  local_68 = 0;
  method._M_bound_args.super__Tuple_impl<0UL,_QPDFLogger_*,_std::_Placeholder<1>,_int>.
  super__Head_base<0UL,_QPDFLogger_*,_false>._M_head_impl._4_4_ = only_if_not_set;
  local_60.super__Mem_fn_base<void_(QPDFLogger::*)(std::shared_ptr<Pipeline>,_bool),_true>._M_pmf =
       (offset_in_QPDFLogger_to_subr)
       std::mem_fn<void(std::shared_ptr<Pipeline>,bool),QPDFLogger>
                 ((_Mem_fn<void_(QPDFLogger::*)(std::shared_ptr<Pipeline>,_bool)> *)
                  QPDFLogger::setSave,0);
  local_78 = std::__shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2> *)l);
  std::
  bind<std::_Mem_fn<void(QPDFLogger::*)(std::shared_ptr<Pipeline>,bool)>,QPDFLogger*,std::_Placeholder<1>const&,int&>
            ((type *)local_50,&local_60,&local_78,(_Placeholder<1> *)&std::placeholders::_1,
             (int *)((long)&method._M_bound_args.
                            super__Tuple_impl<0UL,_QPDFLogger_*,_std::_Placeholder<1>,_int>.
                            super__Head_base<0UL,_QPDFLogger_*,_false>._M_head_impl + 4));
  l_00 = std::__shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2> *)l);
  std::function<void(std::shared_ptr<Pipeline>)>::
  function<std::_Bind<std::_Mem_fn<void(QPDFLogger::*)(std::shared_ptr<Pipeline>,bool)>(QPDFLogger*,std::_Placeholder<1>,int)>&,void>
            ((function<void(std::shared_ptr<Pipeline>)> *)&local_98,(type *)local_50);
  set_log_dest(l_00,&local_98,dest,"save logger",fn,udata);
  std::function<void_(std::shared_ptr<Pipeline>)>::~function(&local_98);
  return;
}

Assistant:

void
qpdflogger_set_save(
    qpdflogger_handle l, qpdf_log_dest_e dest, qpdf_log_fn_t fn, void* udata, int only_if_not_set)
{
    auto method = std::bind(
        std::mem_fn(&QPDFLogger::setSave), l->l.get(), std::placeholders::_1, only_if_not_set);
    set_log_dest(l->l.get(), method, dest, "save logger", fn, udata);
}